

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O2

Clause * __thiscall Inferences::URResolution::Item::generateClause(Item *this)

{
  Literal **ppLVar1;
  Literal **ppLVar2;
  bool bVar3;
  Literal *l;
  Clause *pCVar4;
  CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>
  *i;
  Literal *pLVar5;
  VirtualIterator<Kernel::Literal_*> *litit;
  ulong uVar6;
  SingletonIterator<Kernel::Literal_*> it_00;
  LiteralIterator it;
  Inference inf;
  VirtualIterator<Kernel::Literal_*> local_c0;
  VirtualIterator<Kernel::Literal_*> local_b8;
  VirtualIterator<Kernel::Literal_*> local_b0;
  VirtualIterator<Kernel::Literal_*> local_a8;
  VirtualIterator<Kernel::Literal_*> local_a0;
  VirtualIterator<Kernel::Literal_*> local_98;
  GeneratingInferenceMany local_90;
  Literal *local_80;
  VirtualIterator<Kernel::Literal_*> local_78;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
  local_70;
  Inference local_50;
  
  local_90.premises =
       Lib::List<Kernel::Unit_*>::cons(&this->_orig->super_Unit,(List<Kernel::Unit_*> *)0x0);
  ppLVar1 = (this->_lits)._cursor;
  ppLVar2 = (this->_lits)._stack;
  l = (Literal *)0x0;
  for (uVar6 = 0; ((ulong)((long)ppLVar1 - (long)ppLVar2) >> 3 & 0xffffffff) != uVar6;
      uVar6 = uVar6 + 1) {
    pLVar5 = (this->_lits)._stack[uVar6];
    if (pLVar5 == (Literal *)0x0) {
      local_90.premises =
           Lib::List<Kernel::Unit_*>::cons
                     (&(this->_premises)._array[uVar6]->super_Unit,local_90.premises);
      pLVar5 = l;
    }
    l = pLVar5;
  }
  local_90.rule = UNIT_RESULTING_RESOLUTION;
  Kernel::Inference::Inference(&local_50,&local_90);
  if (this->_ansLit == (Literal *)0x0) {
    Lib::VirtualIterator<Kernel::Literal_*>::getEmpty();
  }
  else {
    it_00._el = (Literal *)0x0;
    it_00._0_8_ = &local_c0;
    Lib::pvi<Lib::SingletonIterator<Kernel::Literal*>>(it_00);
  }
  if (l == (Literal *)0x0) {
    local_b8._core = local_c0._core;
    if (local_c0._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
      (local_c0._core)->_refCnt = (local_c0._core)->_refCnt + 1;
    }
    litit = &local_b8;
    pCVar4 = Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>(litit,&local_50);
  }
  else {
    if ((&this->_ansLit->super_Term == (Term *)0x0) ||
       (bVar3 = Kernel::Term::ground(&this->_ansLit->super_Term), bVar3)) {
      l = Kernel::Renaming::normalize(l);
    }
    local_b0._core = local_c0._core;
    if (local_c0._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
      (local_c0._core)->_refCnt = (local_c0._core)->_refCnt + 3;
    }
    local_a8._core = local_c0._core;
    local_98._core = local_c0._core;
    Lib::iterTraits<Lib::VirtualIterator<Kernel::Literal*>>((Lib *)&local_a0,&local_98);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_98);
    local_90.rule = GENERIC_FORMULA_CLAUSE_TRANSFORMATION;
    local_90.premises = (UnitList *)((ulong)local_90.premises & 0xffffffffffffff00);
    local_78._core = local_a0._core;
    if (local_a0._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
      (local_a0._core)->_refCnt = (local_a0._core)->_refCnt + 1;
    }
    local_80 = l;
    Lib::
    iterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>
              (&local_70,(Lib *)&local_90,i);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_78);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_a0);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_a8);
    pCVar4 = Kernel::Clause::
             fromIterator<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>>
                       (&local_70,&local_50);
    Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_70._iter._it2._iter);
    litit = &local_b0;
  }
  Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(litit);
  Lib::VirtualIterator<Kernel::Literal_*>::~VirtualIterator(&local_c0);
  return pCVar4;
}

Assistant:

Clause* generateClause() const
  {
    UnitList* premLst = 0;
    UnitList::push(_orig, premLst);
    Literal* single = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      if(_lits[i]!=0) {
        ASS_EQ(single,0);
        ASS_EQ(_premises[i],0);
        single = _lits[i];
      }
      else {
        Clause* premise = _premises[i];
        ASS(premise);
        UnitList::push(premise, premLst);
      }
    }

    Inference inf(GeneratingInferenceMany(InferenceRule::UNIT_RESULTING_RESOLUTION, premLst));
    Clause* res;

    LiteralIterator it = _ansLit ? pvi(getSingletonIterator(_ansLit)) : LiteralIterator::getEmpty();
    if(single) {
      if (!_ansLit || _ansLit->ground()) {
        single = Renaming::normalize(single);
      }
      res = Clause::fromIterator(concatIters(getSingletonIterator(single), it), inf);
    }
    else {
      res = Clause::fromIterator(it, inf);
    }
    return res;
  }